

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O1

void btGeometryUtil::getVerticesFromPlaneEquations
               (btAlignedObjectArray<btVector3> *planeEquations,
               btAlignedObjectArray<btVector3> *verticesOut)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  bool bVar8;
  btVector3 *pbVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  btVector3 *pbVar13;
  btVector3 *pbVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btVector3 local_68;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  iVar5 = planeEquations->m_size;
  uVar15 = (ulong)iVar5;
  if (0 < (long)uVar15) {
    local_50 = 2;
    local_58 = 1;
    local_48 = 0;
    do {
      uVar1 = local_48 + 1;
      if (uVar1 < uVar15) {
        pbVar14 = planeEquations->m_data + local_48;
        lVar10 = local_50;
        uVar12 = local_58;
        local_48 = uVar1;
        do {
          local_38 = uVar12 + 1;
          if ((int)local_38 < iVar5) {
            pbVar13 = planeEquations->m_data + uVar12;
            lVar16 = lVar10;
            local_40 = lVar10;
            do {
              pbVar9 = planeEquations->m_data;
              fVar17 = pbVar9[lVar16].m_floats[0];
              fVar22 = pbVar13->m_floats[0];
              fVar27 = (float)*(undefined8 *)(pbVar13->m_floats + 1);
              fVar21 = (float)((ulong)*(undefined8 *)(pbVar13->m_floats + 1) >> 0x20);
              fVar20 = (float)*(undefined8 *)(pbVar9[lVar16].m_floats + 1);
              fVar19 = (float)((ulong)*(undefined8 *)(pbVar9[lVar16].m_floats + 1) >> 0x20);
              fVar23 = fVar27 * fVar19 - fVar20 * fVar21;
              fVar24 = fVar21 * fVar17 - fVar19 * fVar22;
              fVar25 = fVar22 * fVar20 - fVar17 * fVar27;
              if (0.0001 < fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24) {
                fVar4 = pbVar14->m_floats[0];
                fVar26 = (float)*(undefined8 *)(pbVar14->m_floats + 1);
                fVar28 = (float)((ulong)*(undefined8 *)(pbVar14->m_floats + 1) >> 0x20);
                fVar18 = fVar20 * fVar28 - fVar19 * fVar26;
                fVar19 = fVar19 * fVar4 - fVar17 * fVar28;
                fVar17 = fVar17 * fVar26 - fVar4 * fVar20;
                if (0.0001 < fVar17 * fVar17 + fVar18 * fVar18 + fVar19 * fVar19) {
                  fVar20 = fVar21 * fVar26 - fVar28 * fVar27;
                  fVar21 = fVar22 * fVar28 - fVar4 * fVar21;
                  fVar22 = fVar27 * fVar4 - fVar22 * fVar26;
                  if ((0.0001 < fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21) &&
                     (fVar27 = fVar28 * fVar25 + fVar4 * fVar23 + fVar24 * fVar26,
                     1e-06 < ABS(fVar27))) {
                    fVar27 = -1.0 / fVar27;
                    fVar4 = pbVar14->m_floats[3];
                    fVar26 = pbVar13->m_floats[3];
                    fVar28 = pbVar9[lVar16].m_floats[3];
                    local_68.m_floats[1] =
                         fVar27 * (fVar19 * fVar26 + fVar24 * fVar4 + fVar21 * fVar28);
                    local_68.m_floats[0] =
                         fVar27 * (fVar18 * fVar26 + fVar23 * fVar4 + fVar20 * fVar28);
                    local_68.m_floats[2] =
                         (fVar17 * fVar26 + fVar25 * fVar4 + fVar22 * fVar28) * fVar27;
                    local_68.m_floats[3] = 0.0;
                    bVar8 = isPointInsidePlanes(planeEquations,&local_68,0.01);
                    lVar10 = local_40;
                    if (bVar8) {
                      iVar6 = verticesOut->m_size;
                      if (iVar6 == verticesOut->m_capacity) {
                        iVar11 = iVar6 * 2;
                        if (iVar6 == 0) {
                          iVar11 = 1;
                        }
                        if (verticesOut->m_capacity < iVar11) {
                          if (iVar11 == 0) {
                            pbVar9 = (btVector3 *)0x0;
                          }
                          else {
                            pbVar9 = (btVector3 *)btAlignedAllocInternal((long)iVar11 << 4,0x10);
                          }
                          iVar6 = verticesOut->m_size;
                          if (0 < (long)iVar6) {
                            lVar10 = 0;
                            do {
                              puVar2 = (undefined8 *)((long)verticesOut->m_data->m_floats + lVar10);
                              uVar7 = puVar2[1];
                              puVar3 = (undefined8 *)((long)pbVar9->m_floats + lVar10);
                              *puVar3 = *puVar2;
                              puVar3[1] = uVar7;
                              lVar10 = lVar10 + 0x10;
                            } while ((long)iVar6 * 0x10 != lVar10);
                          }
                          if (verticesOut->m_data != (btVector3 *)0x0) {
                            if (verticesOut->m_ownsMemory == true) {
                              btAlignedFreeInternal(verticesOut->m_data);
                            }
                            verticesOut->m_data = (btVector3 *)0x0;
                          }
                          verticesOut->m_ownsMemory = true;
                          verticesOut->m_data = pbVar9;
                          verticesOut->m_capacity = iVar11;
                        }
                      }
                      pbVar9 = verticesOut->m_data;
                      iVar6 = verticesOut->m_size;
                      *(undefined8 *)pbVar9[iVar6].m_floats = local_68.m_floats._0_8_;
                      *(undefined8 *)(pbVar9[iVar6].m_floats + 2) = local_68.m_floats._8_8_;
                      verticesOut->m_size = verticesOut->m_size + 1;
                      lVar10 = local_40;
                    }
                  }
                }
              }
              lVar16 = lVar16 + 1;
            } while ((int)lVar16 < iVar5);
          }
          lVar10 = lVar10 + 1;
          uVar12 = local_38;
          uVar1 = local_48;
        } while (local_38 != uVar15);
      }
      local_48 = uVar1;
      local_50 = local_50 + 1;
      local_58 = local_58 + 1;
    } while (local_48 != uVar15);
  }
  return;
}

Assistant:

void	btGeometryUtil::getVerticesFromPlaneEquations(const btAlignedObjectArray<btVector3>& planeEquations , btAlignedObjectArray<btVector3>& verticesOut )
{
	const int numbrushes = planeEquations.size();
	// brute force:
	for (int i=0;i<numbrushes;i++)
	{
		const btVector3& N1 = planeEquations[i];
		

		for (int j=i+1;j<numbrushes;j++)
		{
			const btVector3& N2 = planeEquations[j];
				
			for (int k=j+1;k<numbrushes;k++)
			{

				const btVector3& N3 = planeEquations[k];

				btVector3 n2n3; n2n3 = N2.cross(N3);
				btVector3 n3n1; n3n1 = N3.cross(N1);
				btVector3 n1n2; n1n2 = N1.cross(N2);
				
				if ( ( n2n3.length2() > btScalar(0.0001) ) &&
					 ( n3n1.length2() > btScalar(0.0001) ) &&
					 ( n1n2.length2() > btScalar(0.0001) ) )
				{
					//point P out of 3 plane equations:

					//	d1 ( N2 * N3 ) + d2 ( N3 * N1 ) + d3 ( N1 * N2 )  
					//P =  -------------------------------------------------------------------------  
					//   N1 . ( N2 * N3 )  


					btScalar quotient = (N1.dot(n2n3));
					if (btFabs(quotient) > btScalar(0.000001))
					{
						quotient = btScalar(-1.) / quotient;
						n2n3 *= N1[3];
						n3n1 *= N2[3];
						n1n2 *= N3[3];
						btVector3 potentialVertex = n2n3;
						potentialVertex += n3n1;
						potentialVertex += n1n2;
						potentialVertex *= quotient;

						//check if inside, and replace supportingVertexOut if needed
						if (isPointInsidePlanes(planeEquations,potentialVertex,btScalar(0.01)))
						{
							verticesOut.push_back(potentialVertex);
						}
					}
				}
			}
		}
	}
}